

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  time_t tVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  int *piVar7;
  small_alloc_info *psVar8;
  ulong uVar9;
  int extraout_EDX;
  uint uVar10;
  small_alloc *info;
  slab_cache *psVar11;
  int iVar12;
  small_alloc *psVar13;
  int iVar14;
  pthread_t *actual_alloc_factor;
  float *actual_alloc_factor_00;
  long lVar15;
  small_alloc_info *arena;
  slab_cache *psVar16;
  int i;
  char *cache;
  long lVar17;
  undefined1 auStack_330 [24];
  rlist *prStack_318;
  int iStack_310;
  int iStack_30c;
  int iStack_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  small_alloc *psStack_2f8;
  undefined *puStack_2f0;
  char *pcStack_2e8;
  small_alloc_info *psStack_2e0;
  slab_cache *psStack_2d8;
  code *pcStack_2d0;
  undefined1 local_2c8 [8];
  slab_cache cache1;
  slab_arena arena1;
  quota quota1;
  
  pcStack_2d0 = (code *)0x102aba;
  plan(4);
  pcStack_2d0 = (code *)0x102aca;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102ae2;
  printf("# *** %s ***\n","main");
  pcStack_2d0 = (code *)0x102ae9;
  tVar3 = time((time_t *)0x0);
  seed = (uint)tVar3;
  pcStack_2d0 = (code *)0x102af8;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102b12;
  fwrite("# ",2,1,_stdout);
  pcStack_2d0 = (code *)0x102b2a;
  fprintf(_stdout,"random seed is %u",(ulong)seed);
  pcStack_2d0 = (code *)0x102b38;
  fputc(10,_stdout);
  pcStack_2d0 = (code *)0x102b43;
  srand(seed);
  quota.value = 0x40000000000000;
  pcStack_2d0 = (code *)0x102b77;
  slab_arena_create(&::arena,&quota,0,4000000,2);
  pcStack_2d0 = (code *)0x102b86;
  slab_cache_create(&::cache,&::arena);
  pcStack_2d0 = (code *)0x102b90;
  plan(1);
  pcStack_2d0 = (code *)0x102b99;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102bad;
  printf("# *** %s ***\n","small_alloc_basic");
  pcStack_2d0 = (code *)0x102bcc;
  small_alloc_test(0xc,5000,1000,0x400,5000);
  pcStack_2d0 = (code *)0x102bfb;
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x75,
      "line %d",0x75);
  pcStack_2d0 = (code *)0x102c04;
  _space((FILE *)_stdout);
  cache = "# *** %s: done ***\n";
  pcStack_2d0 = (code *)0x102c18;
  printf("# *** %s: done ***\n","small_alloc_basic");
  pcStack_2d0 = (code *)0x102c1d;
  check_plan();
  pcStack_2d0 = (code *)0x102c27;
  plan(1);
  pcStack_2d0 = (code *)0x102c30;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102c44;
  printf("# *** %s ***\n","small_alloc_large");
  pcStack_2d0 = (code *)0x102c6e;
  small_alloc_test((::cache.arena)->slab_size - 0x70 >> 4 & 0xfffffff8,
                   (::cache.arena)->slab_size * 2,0x32,10,100);
  pcStack_2d0 = (code *)0x102c96;
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x86,
      "line %d",0x86);
  pcStack_2d0 = (code *)0x102c9f;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102cac;
  printf("# *** %s: done ***\n","small_alloc_large");
  pcStack_2d0 = (code *)0x102cb1;
  check_plan();
  pcStack_2d0 = (code *)0x102cbb;
  plan(1);
  pcStack_2d0 = (code *)0x102cc4;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102cd5;
  printf("# *** %s ***\n","test_small_alloc_info");
  info = &alloc;
  actual_alloc_factor = &cache1.thread_id;
  pcStack_2d0 = (code *)0x102d01;
  small_alloc_create(&alloc,&::cache,0x40,0x40,1.5,(float *)actual_alloc_factor);
  iVar14 = (int)actual_alloc_factor;
  arena = (small_alloc_info *)local_2c8;
  iVar12 = 0x10d3b8;
  iVar2 = 0;
  pcStack_2d0 = (code *)0x102d1a;
  psVar8 = arena;
  small_alloc_info(&alloc,(void *)0x0,0x101,arena);
  iVar1 = (int)psVar8;
  if (local_2c8[0] == false) {
    if (cache1.arena != (slab_arena *)0x200) goto LAB_00103027;
    iVar12 = 0x10d3b8;
    info = (small_alloc *)local_2c8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102d52;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x200,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] != false) goto LAB_0010302c;
    if (cache1.arena != (slab_arena *)0x200) goto LAB_00103031;
    iVar12 = 0x10d3b8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102d82;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x4001,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] != false) goto LAB_00103036;
    if (cache1.arena != (slab_arena *)0x40000) goto LAB_0010303b;
    iVar12 = 0x10d3b8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102db2;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x40000,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] != false) goto LAB_00103040;
    if (cache1.arena != (slab_arena *)0x40000) goto LAB_00103045;
    iVar12 = 0x10d3b8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102de2;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x40001,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] == false) goto LAB_0010304a;
    if (cache1.arena != (slab_arena *)0x40001) goto LAB_0010304f;
    pcStack_2d0 = (code *)0x102e28;
    _ok(1,"true",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
        0xb5,"line %d",0xb5);
    info = &alloc;
    pcStack_2d0 = (code *)0x102e37;
    small_alloc_destroy(&alloc);
    pcStack_2d0 = (code *)0x102e40;
    _space((FILE *)_stdout);
    pcStack_2d0 = (code *)0x102e55;
    printf("# *** %s: done ***\n","test_small_alloc_info");
    pcStack_2d0 = (code *)0x102e5a;
    check_plan();
    pcStack_2d0 = (code *)0x102e64;
    plan(1);
    pcStack_2d0 = (code *)0x102e6d;
    _space((FILE *)_stdout);
    pcStack_2d0 = (code *)0x102e82;
    printf("# *** %s ***\n","small_alloc_low_alloc_factor");
    arena1.slab_size = 0;
    arena1.flags = 0x400;
    arena = (small_alloc_info *)&cache1.thread_id;
    pcStack_2d0 = (code *)0x102eac;
    slab_arena_create((slab_arena *)arena,(quota *)&arena1.slab_size,0,4000000,2);
    cache = local_2c8;
    pcStack_2d0 = (code *)0x102ebe;
    slab_cache_create((slab_cache *)cache,(slab_arena *)arena);
    actual_alloc_factor_00 = (float *)((long)&quota1.value + 4);
    iVar12 = 0x10d3b8;
    iVar1 = 8;
    pcStack_2d0 = (code *)0x102edf;
    psVar11 = (slab_cache *)cache;
    small_alloc_create(&alloc,(slab_cache *)cache,0xc,8,1.001,actual_alloc_factor_00);
    iVar2 = (int)psVar11;
    iVar14 = (int)actual_alloc_factor_00;
    if (alloc.small_mempool_cache_size != 0x400) goto LAB_00103054;
    if (alloc.objsize_max < 0x400) goto LAB_00103059;
    iVar12 = 0x400;
    iVar2 = 8;
    pcStack_2d0 = (code *)0x102f0e;
    pvVar4 = calloc(0x400,8);
    if (pvVar4 != (void *)0x0) {
      lVar17 = 0;
      do {
        pcStack_2d0 = (code *)0x102f31;
        pvVar5 = smalloc(&alloc,0x400);
        if (pvVar5 == (void *)0x0) break;
        *(void **)((long)pvVar4 + lVar17 * 8) = pvVar5;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x400);
      lVar17 = 0;
      do {
        pvVar5 = *(void **)((long)pvVar4 + lVar17 * 8);
        if (pvVar5 == (void *)0x0) break;
        pcStack_2d0 = (code *)0x102f66;
        smfree(&alloc,pvVar5,0x400);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x400);
      pcStack_2d0 = (code *)0x102f7e;
      small_alloc_destroy(&alloc);
      pcStack_2d0 = (code *)0x102f8a;
      slab_cache_destroy((slab_cache *)local_2c8);
      pcStack_2d0 = (code *)0x102f93;
      slab_arena_destroy((slab_arena *)&cache1.thread_id);
      pcStack_2d0 = (code *)0x102fbf;
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          0xee,"line %d",0xee);
      pcStack_2d0 = (code *)0x102fc8;
      _space((FILE *)_stdout);
      pcStack_2d0 = (code *)0x102fe0;
      printf("# *** %s: done ***\n","small_alloc_low_alloc_factor");
      pcStack_2d0 = (code *)0x102fe5;
      check_plan();
      pcStack_2d0 = (code *)0x102ff1;
      slab_cache_destroy(&::cache);
      pcStack_2d0 = (code *)0x102ffa;
      _space((FILE *)_stdout);
      pcStack_2d0 = (code *)0x10300b;
      printf("# *** %s: done ***\n","main");
      pcStack_2d0 = (code *)0x103010;
      iVar1 = check_plan();
      return iVar1;
    }
  }
  else {
    pcStack_2d0 = (code *)0x103027;
    main_cold_1();
LAB_00103027:
    pcStack_2d0 = (code *)0x10302c;
    main_cold_2();
LAB_0010302c:
    pcStack_2d0 = (code *)0x103031;
    main_cold_3();
LAB_00103031:
    pcStack_2d0 = (code *)0x103036;
    main_cold_4();
LAB_00103036:
    pcStack_2d0 = (code *)0x10303b;
    main_cold_5();
LAB_0010303b:
    pcStack_2d0 = (code *)0x103040;
    main_cold_6();
LAB_00103040:
    pcStack_2d0 = (code *)0x103045;
    main_cold_7();
LAB_00103045:
    pcStack_2d0 = (code *)0x10304a;
    main_cold_8();
LAB_0010304a:
    pcStack_2d0 = (code *)0x10304f;
    main_cold_13();
LAB_0010304f:
    pcStack_2d0 = (code *)0x103054;
    main_cold_9();
LAB_00103054:
    pcStack_2d0 = (code *)0x103059;
    main_cold_10();
LAB_00103059:
    pcStack_2d0 = (code *)0x10305e;
    main_cold_11();
  }
  pcStack_2d0 = small_alloc_test;
  main_cold_12();
  pcStack_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c";
  puStack_2f0 = &stdout;
  psVar13 = &alloc;
  psVar11 = &::cache;
  iStack_310 = extraout_EDX;
  iStack_304 = iVar1;
  iStack_2fc = iVar2;
  psStack_2f8 = info;
  psStack_2e0 = arena;
  psStack_2d8 = (slab_cache *)cache;
  pcStack_2d0 = (code *)&stack0xfffffffffffffff8;
  small_alloc_create(&alloc,&::cache,0xc,8,1.3,(float *)(auStack_330 + 0x14));
  iStack_300 = iVar14;
  if (0 < iVar14) {
    iStack_30c = iStack_2fc - iVar12;
    iVar1 = 0;
    do {
      iStack_308 = iVar1;
      iVar1 = rand();
      uVar9 = (long)iVar1 % (long)iStack_304 & 0xffffffff;
      if (0 < (int)((long)iVar1 % (long)iStack_304)) {
        do {
          iVar1 = rand();
          iVar1 = iVar1 % iStack_310;
          if (iStack_2fc <= iVar12) {
LAB_001032a0:
            __assert_fail("size_max > size_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                          ,0x28,"void *alloc_checked(int, int, int)");
          }
          iVar2 = rand();
          iVar2 = iVar2 % iStack_30c;
          psVar11 = (slab_cache *)ptrs[iVar1];
          if (psVar11 != (slab_cache *)0x0) {
            if (*(int *)&psVar11->arena != iVar1) {
              __assert_fail("ptrs[pos][0] == pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                            ,0x2c,"void *alloc_checked(int, int, int)");
            }
            if ((999 < iVar1) ||
               (uVar6 = (ulong)*(int *)((long)&psVar11->arena + 4),
               *(int *)((long)psVar11->orders + ((uVar6 & 0xfffffffffffffffc) - 0x34)) != iVar1)) {
              small_alloc_test_cold_1();
              goto LAB_001032a0;
            }
            *(undefined4 *)((long)psVar11->orders + ((uVar6 & 0xfffffffffffffffc) - 0x34)) =
                 0x7fffffff;
            *(undefined4 *)&psVar11->arena = 0x7fffffff;
            psVar13 = &alloc;
            smfree(&alloc,psVar11,(long)*(int *)((long)&psVar11->arena + 4));
            ptrs[iVar1] = (int *)0x0;
          }
          if (allocating == true) {
            iVar2 = iVar2 + iVar12;
            psVar16 = (slab_cache *)(long)iVar2;
            psVar13 = &alloc;
            psVar11 = psVar16;
            piVar7 = (int *)smalloc(&alloc,(size_t)psVar16);
            if (piVar7 == (int *)0x0) {
              small_alloc_test_cold_6();
              goto LAB_001032e3;
            }
            ptrs[iVar1] = piVar7;
            *piVar7 = iVar1;
            piVar7[1] = iVar2;
            *(int *)((long)piVar7 + (((ulong)psVar16 & 0xfffffffffffffffc) - 4)) = iVar1;
          }
          uVar10 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      allocating = (_Bool)(allocating ^ 1);
      iVar1 = iStack_308 + 1;
    } while (iVar1 != iStack_300);
  }
  lVar17 = 0;
  do {
    psVar16 = *(slab_cache **)((long)ptrs + lVar17);
    if (psVar16 != (slab_cache *)0x0) {
      lVar15 = (long)*(int *)&psVar16->arena;
      if ((999 < lVar15) ||
         (uVar9 = (ulong)*(int *)((long)&psVar16->arena + 4),
         *(int *)((long)psVar16->orders + ((uVar9 & 0xfffffffffffffffc) - 0x34)) !=
         *(int *)&psVar16->arena)) goto LAB_001032e3;
      psVar11 = (slab_cache *)ptrs[lVar15];
      if (psVar11 != psVar16) goto LAB_001032e8;
      *(undefined4 *)((long)psVar11->orders + ((uVar9 & 0xfffffffffffffffc) - 0x34)) = 0x7fffffff;
      *(undefined4 *)&psVar11->arena = 0x7fffffff;
      psVar13 = &alloc;
      smfree(&alloc,psVar11,(long)*(int *)((long)&psVar11->arena + 4));
      ptrs[lVar15] = (int *)0x0;
    }
    lVar17 = lVar17 + 8;
  } while (lVar17 != 8000);
  prStack_318 = (rlist *)0x0;
  psVar13 = &alloc;
  psVar11 = (slab_cache *)auStack_330;
  small_stats(&alloc,(small_stats *)psVar11,small_is_unused_cb,&prStack_318);
  if ((slab_arena *)auStack_330._0_8_ == (slab_arena *)0x0) {
    if (::cache.allocated.stats.used <= prStack_318) {
      small_alloc_destroy(&alloc);
      return extraout_EAX;
    }
    goto LAB_001032f2;
  }
  goto LAB_001032ed;
LAB_001032e3:
  small_alloc_test_cold_2();
LAB_001032e8:
  small_alloc_test_cold_3();
LAB_001032ed:
  small_alloc_test_cold_4();
LAB_001032f2:
  small_alloc_test_cold_5();
  psVar11->arena =
       (slab_arena *)
       ((long)&(psVar11->arena->cache).next +
       (ulong)(uint)(*(int *)((long)&psVar13->small_mempool_cache[0].pool.cache + 4) *
                    *(int *)&psVar13->small_mempool_cache[0].pool.cache));
  return 0;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(4);
#endif
	header();

	seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0, 4000000,
			  MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	small_alloc_basic();
#ifndef ENABLE_ASAN
	small_alloc_large();
	test_small_alloc_info();
	small_alloc_low_alloc_factor();
#else
	small_wrong_size_in_free();
	small_membership();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}